

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_4.hpp
# Opt level: O0

unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::draft4::
schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_maximum_validator_4
          (schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent)

{
  bool bVar1;
  undefined8 uVar2;
  reference this_00;
  undefined1 uVar3;
  string *in_RDX;
  __uniq_ptr_data<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
  in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_R8;
  const_object_iterator cVar4;
  iterator iVar5;
  const_object_iterator it;
  bool is_exclusive;
  string message;
  uri schema_location;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffffd48;
  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
  *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd60;
  unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *this_01;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd78;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *this_02;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_03;
  undefined8 local_221;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  allocator<char> local_1d1;
  string local_1d0 [32];
  string *in_stack_fffffffffffffe50;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe58;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_178;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_158;
  undefined1 local_150;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_148;
  undefined1 local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  byte local_112;
  allocator<char> local_111 [56];
  undefined1 local_d9 [177];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_28;
  string *local_18;
  
  this_03 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_d9;
  local_28 = in_R8;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                    (in_stack_fffffffffffffd68);
  if (bVar1) {
    local_112 = 0;
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      (in_stack_fffffffffffffd68);
    if (bVar1) {
      in_stack_fffffffffffffd90 = &local_138;
      in_stack_fffffffffffffd88 = local_28;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      cVar4 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                        (this_03,(string_view_type *)in_RDX);
      local_148 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)cVar4.it_._M_current;
      uVar3 = cVar4.has_value_;
      local_140 = uVar3;
      local_138.field_2._M_allocated_capacity = (size_type)local_148;
      local_138.field_2._M_local_buf[8] = uVar3;
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (in_stack_fffffffffffffe00);
      iVar5 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
              ::end(&local_178);
      local_158 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)iVar5.it_._M_current;
      local_150 = iVar5.has_value_;
      bVar1 = detail::
              random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
              ::operator!=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      if (bVar1) {
        this_00 = detail::
                  random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                  ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                               *)0x8ba39a);
        key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::value(this_00);
        in_stack_fffffffffffffd87 =
             basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        CONCAT17(uVar3,in_stack_fffffffffffffd98));
        local_112 = in_stack_fffffffffffffd87;
      }
    }
    if ((local_112 & 1) == 0) {
      this_01 = (unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)&local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::get_custom_message(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      std::
      make_unique<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                (in_stack_fffffffffffffd88,
                 (uri *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd78,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd70);
      std::
      unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      unique_ptr<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,void>
                (this_01,(unique_ptr<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)local_18);
      std::
      unique_ptr<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr((unique_ptr<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)local_28);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
      std::__cxx11::string::~string((string *)((long)&local_221 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
    }
    else {
      this_02 = (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)&local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::get_custom_message(this_02,local_18);
      std::
      make_unique<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                (in_stack_fffffffffffffd88,
                 (uri *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_18);
      std::
      unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      unique_ptr<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,void>
                ((unique_ptr<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd60,
                 (unique_ptr<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd58);
      std::
      unique_ptr<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr((unique_ptr<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::exclusive_maximum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffd50);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
    }
    jsoncons::uri::~uri((uri *)0x8ba691);
    return (__uniq_ptr_data<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )(tuple<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )in_RDI.
               super___uniq_ptr_impl<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               .
               super__Head_base<0UL,_jsoncons::jsonschema::keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
               ._M_head_impl;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::allocator<char>::~allocator(local_111);
  uVar2 = __cxa_allocate_exception(0x18);
  schema_error::schema_error((schema_error *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  __cxa_throw(uVar2,&schema_error::typeinfo,schema_error::~schema_error);
}

Assistant:

std::unique_ptr<keyword_validator<Json>> make_maximum_validator_4(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent)
        {
            uri schema_location = context.make_schema_location("maximum");
            if (!sch.is_number())
            {
                const std::string message("maximum must be a number value");
                JSONCONS_THROW(schema_error(message));
            }
            
            bool is_exclusive = false;

            if (parent.is_object())
            {
                auto it = parent.find("exclusiveMaximum");
                if (it != parent.object_range().end())
                {
                    is_exclusive = (*it).value().as_bool();
                }
            }
            if (is_exclusive)
            {
                return jsoncons::make_unique<exclusive_maximum_validator<Json>>(parent, schema_location, 
                    context.get_custom_message("maximum"), sch);
            }
            else
            {
                return jsoncons::make_unique<maximum_validator<Json>>(parent, schema_location,
                    context.get_custom_message("maximum"), sch);
            }
        }